

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

shared_ptr<chatra::Node> *
chatra::
addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
          (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           *container,shared_ptr<chatra::Line> *line,NodeType type)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<chatra::Node> local_30;
  
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xd0);
  (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00243c38;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
  ;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _M_use_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _M_weak_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _M_use_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _M_weak_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined4 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [4]._vptr__Sp_counted_base + 4) = 0xffffffff;
  *(undefined1 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
    _vptr__Sp_counted_base = 0xff;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [6]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
    _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [7]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
    _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [8]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
    _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [9]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
    _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [10]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[10].
    _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [0xb]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xb].
    _M_weak_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
  _M_use_count = 0;
  local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
  _M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           [5]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
    _M_weak_count = 0;
  std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
  emplace_back<std::shared_ptr<chatra::Node>>
            ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>> *)
             container,&local_30);
  if (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  psVar1 = (container->
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar2 = psVar1[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->type = type;
  (peVar2->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (line->super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(line->super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return psVar1 + -1;
}

Assistant:

static std::shared_ptr<Node>& addNode(NodePtrContainer& container, const std::shared_ptr<Line>& line, NodeType type) {
	container.emplace_back(std::make_shared<Node>());
	auto& node = container.back();

	node->type = type;
	node->line = line;
	return node;
}